

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_loadlib(lua_State *L)

{
  int iVar1;
  size_t *len;
  lua_State *L_00;
  lua_State *in_RDI;
  int st;
  char *init;
  char *path;
  size_t *in_stack_ffffffffffffffe8;
  int idx;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  len = (size_t *)
        luaL_checklstring((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                          ,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8);
  L_00 = (lua_State *)
         luaL_checklstring((lua_State *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (int)((ulong)in_RDI >> 0x20),len);
  idx = (int)((ulong)len >> 0x20);
  iVar1 = ll_loadfunc(L,path,init,st);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    lua_pushnil(L_00);
    lua_insert(in_RDI,idx);
    lua_pushstring((lua_State *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (char *)in_RDI);
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

static int lj_cf_package_loadlib(lua_State *L)
{
  const char *path = luaL_checkstring(L, 1);
  const char *init = luaL_checkstring(L, 2);
  int st = ll_loadfunc(L, path, init, 1);
  if (st == 0) {  /* no errors? */
    return 1;  /* return the loaded function */
  } else {  /* error; error message is on stack top */
    lua_pushnil(L);
    lua_insert(L, -2);
    lua_pushstring(L, (st == PACKAGE_ERR_LIB) ?  PACKAGE_LIB_FAIL : "init");
    return 3;  /* return nil, error message, and where */
  }
}